

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O2

bool __thiscall
sptk::StatisticsAccumulation::GetMean
          (StatisticsAccumulation *this,Buffer *buffer,vector<double,_std::allocator<double>_> *mean
          )

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  size_t __n;
  pointer pdVar4;
  bool bVar5;
  size_type __new_size;
  
  bVar5 = false;
  if ((((this->is_valid_ == true) && (bVar5 = false, 0 < this->num_statistics_order_)) &&
      (bVar5 = false, mean != (vector<double,_std::allocator<double>_> *)0x0)) &&
     (0 < buffer->zeroth_order_statistics_)) {
    __new_size = (long)this->num_order_ + 1;
    if ((long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(mean,__new_size);
    }
    if (this->numerically_stable_ == true) {
      pdVar4 = (buffer->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = true;
      __n = (long)(buffer->first_order_statistics_).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar4;
      if (__n != 0) {
        memmove((mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar4,__n);
      }
    }
    else {
      iVar1 = buffer->zeroth_order_statistics_;
      pdVar2 = (buffer->first_order_statistics_).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pdVar4 = (mean->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (pdVar3 = (buffer->first_order_statistics_).
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start; pdVar3 != pdVar2; pdVar3 = pdVar3 + 1) {
        *pdVar4 = *pdVar3 * (1.0 / (double)iVar1);
        pdVar4 = pdVar4 + 1;
      }
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool StatisticsAccumulation::GetMean(
    const StatisticsAccumulation::Buffer& buffer,
    std::vector<double>* mean) const {
  if (!is_valid_ || num_statistics_order_ < 1 ||
      buffer.zeroth_order_statistics_ <= 0 || NULL == mean) {
    return false;
  }

  if (mean->size() != static_cast<std::size_t>(num_order_ + 1)) {
    mean->resize(num_order_ + 1);
  }

  if (numerically_stable_) {
    std::copy(buffer.first_order_statistics_.begin(),
              buffer.first_order_statistics_.end(), mean->begin());
  } else {
    const double z(1.0 / buffer.zeroth_order_statistics_);
    std::transform(buffer.first_order_statistics_.begin(),
                   buffer.first_order_statistics_.end(), mean->begin(),
                   [z](double x) { return z * x; });
  }

  return true;
}